

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

color_t __thiscall Image::Get(Image *this,int x,int y)

{
  color_t cVar1;
  const_reference pvVar2;
  int y_local;
  int x_local;
  Image *this_local;
  
  pvVar2 = std::vector<color_t,_std::allocator<color_t>_>::at
                     (&this->pixels_,(long)(y * this->width_ + x));
  cVar1.r = pvVar2->r;
  cVar1.g = pvVar2->g;
  cVar1.b = pvVar2->b;
  return cVar1;
}

Assistant:

color_t Get(int x, int y) const { return pixels_.at(y * width_ + x); }